

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_unarrow_sat8_aarch64(CPUARMState_conflict *env,uint64_t x)

{
  uint local_20;
  byte local_1b;
  uint32_t res;
  uint8_t d;
  uint16_t s;
  uint64_t x_local;
  CPUARMState_conflict *env_local;
  
  local_20 = 0;
  if ((x & 0x8000) == 0) {
    if ((ushort)x < 0x100) {
      local_1b = (byte)x;
    }
    else {
      local_1b = 0xff;
      (env->vfp).qc[0] = 1;
    }
    local_20 = (uint)local_1b;
  }
  else {
    (env->vfp).qc[0] = 1;
  }
  if ((x & 0x80000000) == 0) {
    if ((ushort)(x >> 0x10) < 0x100) {
      local_1b = (byte)(x >> 0x10);
    }
    else {
      local_1b = 0xff;
      (env->vfp).qc[0] = 1;
    }
    local_20 = (uint)local_1b << 8 | local_20;
  }
  else {
    (env->vfp).qc[0] = 1;
  }
  if ((x & 0x800000000000) == 0) {
    if ((ushort)(x >> 0x20) < 0x100) {
      local_1b = (byte)(x >> 0x20);
    }
    else {
      local_1b = 0xff;
      (env->vfp).qc[0] = 1;
    }
    local_20 = (uint)local_1b << 0x10 | local_20;
  }
  else {
    (env->vfp).qc[0] = 1;
  }
  if ((x & 0x8000000000000000) == 0) {
    if ((ushort)(x >> 0x30) < 0x100) {
      local_1b = (byte)(x >> 0x30);
    }
    else {
      local_1b = 0xff;
      (env->vfp).qc[0] = 1;
    }
    local_20 = (uint)local_1b << 0x18 | local_20;
  }
  else {
    (env->vfp).qc[0] = 1;
  }
  return local_20;
}

Assistant:

uint32_t HELPER(neon_unarrow_sat8)(CPUARMState *env, uint64_t x)
{
    uint16_t s;
    uint8_t d;
    uint32_t res = 0;
#define SAT8(n) \
    s = x >> n; \
    if (s & 0x8000) { \
        SET_QC(); \
    } else { \
        if (s > 0xff) { \
            d = 0xff; \
            SET_QC(); \
        } else  { \
            d = s; \
        } \
        res |= (uint32_t)d << (n / 2); \
    }

    SAT8(0);
    SAT8(16);
    SAT8(32);
    SAT8(48);
#undef SAT8
    return res;
}